

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void pqdownheap(deflate_state *s,ct_data *tree,int k)

{
  int iVar1;
  int j;
  int v;
  int k_local;
  ct_data *tree_local;
  deflate_state *s_local;
  
  iVar1 = s->heap[k];
  k_local = k;
  for (j = k << 1; j <= s->heap_len; j = j << 1) {
    if ((j < s->heap_len) &&
       ((tree[s->heap[j + 1]].fc.freq < tree[s->heap[j]].fc.freq ||
        ((tree[s->heap[j + 1]].fc.freq == tree[s->heap[j]].fc.freq &&
         (s->depth[s->heap[j + 1]] <= s->depth[s->heap[j]])))))) {
      j = j + 1;
    }
    if ((tree[iVar1].fc.freq < tree[s->heap[j]].fc.freq) ||
       ((tree[iVar1].fc.freq == tree[s->heap[j]].fc.freq &&
        (s->depth[iVar1] <= s->depth[s->heap[j]])))) break;
    s->heap[k_local] = s->heap[j];
    k_local = j;
  }
  s->heap[k_local] = iVar1;
  return;
}

Assistant:

static void pqdownheap(deflate_state *s, ct_data *tree, int k) {
    /* tree: the tree to restore */
    /* k: node to move down */
    int v = s->heap[k];
    int j = k << 1;  /* left son of k */
    while (j <= s->heap_len) {
        /* Set j to the smallest of the two sons: */
        if (j < s->heap_len && smaller(tree, s->heap[j+1], s->heap[j], s->depth)) {
            j++;
        }
        /* Exit if v is smaller than both sons */
        if (smaller(tree, v, s->heap[j], s->depth))
            break;

        /* Exchange v with the smallest son */
        s->heap[k] = s->heap[j];
        k = j;

        /* And continue down the tree, setting j to the left son of k */
        j <<= 1;
    }
    s->heap[k] = v;
}